

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

ostream * nuraft::operator<<(ostream *out,buffer *buf)

{
  long lVar1;
  char *pcVar2;
  
  if (((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 5) != 0) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,(error_code *)"bad output stream.");
    __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  if (*(int *)buf < 0) {
    lVar1 = (ulong)*(uint *)(buf + 4) + 8;
  }
  else {
    lVar1 = (ulong)*(ushort *)(buf + 2) + 4;
  }
  std::ostream::write((char *)out,(long)(buf + lVar1));
  if (((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 5) != 0) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,(error_code *)"write failed");
    __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  return out;
}

Assistant:

std::ostream& nuraft::operator << (std::ostream& out, buffer& buf) {
    if (!out) {
        throw std::ios::failure("bad output stream.");
    }

    out.write(reinterpret_cast<char*>(buf.data()), buf.size() - buf.pos());

    if (!out) {
        throw std::ios::failure("write failed");
    }

    return out;
}